

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::system_error::system_error<int,int>
          (system_error *this,int error_code,string_view message,int *args,int *args_1)

{
  std::runtime_error::runtime_error(&this->super_runtime_error,"");
  *(undefined ***)this = &PTR__runtime_error_0017e0d8;
  init(this,(EVP_PKEY_CTX *)(ulong)(uint)error_code);
  return;
}

Assistant:

system_error(int error_code, string_view message, const Args &... args)
    : std::runtime_error("") {
    init(error_code, message, make_format_args(args...));
  }